

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O2

char * cmime_part_to_string(CMimePart_T *part,char *nl)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  CMimeList_T *pCVar7;
  
  if (part == (CMimePart_T *)0x0) {
    __assert_fail("part",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0xb0,"char *cmime_part_to_string(CMimePart_T *, const char *)");
  }
  pcVar6 = part->content;
  if (nl == (char *)0x0) {
    if (pcVar6 == (char *)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = _cmime_internal_determine_linebreak(pcVar6);
    }
    nl = "\r\n";
    if (pcVar2 != (char *)0x0) {
      nl = pcVar2;
    }
  }
  pcVar2 = (char *)calloc(1,1);
  pCVar7 = part->headers;
  if (pCVar7->size != 0) {
    while (pCVar7 = (CMimeList_T *)pCVar7->head, pCVar7 != (CMimeList_T *)0x0) {
      __s = cmime_header_to_string(*(CMimeHeader_T **)pCVar7);
      sVar3 = strlen(__s);
      sVar4 = strlen(nl);
      iVar1 = strcmp(__s + (sVar3 - sVar4),nl);
      sVar5 = strlen(pcVar2);
      if (iVar1 == 0) {
        pcVar2 = (char *)realloc(pcVar2,sVar3 + 1 + sVar5);
        strcat(pcVar2,__s);
      }
      else {
        pcVar2 = (char *)realloc(pcVar2,sVar3 + 1 + sVar4 + sVar5);
        strcat(pcVar2,__s);
        strcat(pcVar2,nl);
      }
      free(__s);
    }
    sVar3 = strlen(pcVar2);
    sVar4 = strlen(nl);
    pcVar2 = (char *)realloc(pcVar2,sVar3 + sVar4 + 2);
    strcat(pcVar2,nl);
  }
  if (pcVar6 == (char *)0x0) {
    return pcVar2;
  }
  sVar3 = strlen(pcVar2);
  sVar4 = strlen(pcVar6);
  pcVar2 = (char *)realloc(pcVar2,sVar3 + sVar4 + 2);
  pcVar6 = strcat(pcVar2,pcVar6);
  return pcVar6;
}

Assistant:

char *cmime_part_to_string(CMimePart_T *part, const char *nl) {
    char *out = NULL;
    char *content = NULL; 
    char *ptemp = NULL;
    int with_headers = 0;
    CMimeListElem_T *e;
    CMimeHeader_T *h;
    
    assert(part);

    content = cmime_part_get_content(part);
    
    if (nl == NULL) {
        if (content != NULL)
            nl = _cmime_internal_determine_linebreak(content);  
        
        if (nl == NULL)
            nl = CRLF;
    }

    out = (char *)calloc(1,sizeof(char));
    if (cmime_list_size(part->headers)!=0) {
        e = cmime_list_head(part->headers);
        while(e != NULL) {
            h = (CMimeHeader_T *)cmime_list_data(e);
            ptemp = cmime_header_to_string(h);
            /* check whether we have to add a newline, or not */
            if ( strcmp(ptemp + strlen(ptemp) - strlen(nl), nl) == 0) {
                out = (char *)realloc(out,strlen(out) + strlen(ptemp) + 1);
                strcat(out,ptemp);
            } else {
                out = (char *)realloc(out,strlen(out) + strlen(ptemp) + strlen(nl) + 1);
                strcat(out,ptemp);
                strcat(out,nl);
            }
            free(ptemp);
            e = e->next;
        } 
        with_headers = 1; 
    }
    
    if (with_headers==1) {
        out = (char *)realloc(out,strlen(out) + strlen(nl) + 2);
        strcat(out,nl);
    } 

    if (content != NULL) {
        out = (char *)realloc(out,strlen(out) + strlen(content) + 2);
        strcat(out,content);
    }
    return(out);
}